

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqarray.h
# Opt level: O0

void __thiscall SQArray::Finalize(SQArray *this)

{
  SQObjectPtr *this_00;
  SQUnsignedInteger in_stack_ffffffffffffffd8;
  sqvector<SQObjectPtr> *in_stack_ffffffffffffffe0;
  SQObjectPtr local_18;
  
  this_00 = &local_18;
  ::SQObjectPtr::SQObjectPtr(this_00);
  sqvector<SQObjectPtr>::resize(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,this_00);
  ::SQObjectPtr::~SQObjectPtr(this_00);
  return;
}

Assistant:

void Finalize(){
        _values.resize(0);
    }